

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
TempBanIRCCommand::trigger
          (TempBanIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  string_view name;
  string_view name_00;
  size_t sVar1;
  seconds sVar2;
  char *pcVar3;
  player_search_result pVar4;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> dVar5;
  undefined8 uStackY_d0;
  size_type local_b0;
  char *local_a8;
  string banner;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  string_view nick_local;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  
  sVar2.__r = pluginInstance.m_defaultTempBanTime.__r;
  nick_local._M_str = nick._M_str;
  nick_local._M_len = nick._M_len;
  if (parameters._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,nick_local._M_len,nick_local._M_str,0x47,
               "Error: Too Few Parameters. Syntax: TempBan [Duration] <Player> [Reason]");
    return;
  }
  banner._M_dataplus._M_p = (pointer)parameters._M_len;
  banner._M_string_length = (size_type)parameters._M_str;
  local_78._M_len = 2;
  local_78._M_str = " \t";
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&command_split,(basic_string_view<char,_std::char_traits<char>_> *)&banner,&local_78);
  pcVar3 = command_split.first._M_str;
  sVar1 = command_split.first._M_len;
  name._M_str = command_split.first._M_str;
  name._M_len = command_split.first._M_len;
  local_b0 = command_split.second._M_len;
  local_a8 = command_split.second._M_str;
  pVar4 = findPlayerByPartName(source,channel,name);
  if (pVar4.player == (PlayerInfo *)0x0 && pVar4.server != (Server *)0x0) {
    if (command_split.second._M_len != 0) {
      dVar5 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (pcVar3,pcVar3 + sVar1);
      sVar2.__r = (rep)dVar5.duration.__r;
      if (0 < sVar2.__r) {
        local_78._M_len = 2;
        local_78._M_str = " \t";
        jessilib::
        word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&banner,&command_split.second,&local_78);
        command_split.first._M_len = (size_t)banner._M_dataplus._M_p;
        command_split.first._M_str = (char *)banner._M_string_length;
        command_split.second._M_len = banner.field_2._M_allocated_capacity;
        command_split.second._M_str = (char *)banner.field_2._8_8_;
        if (pluginInstance.m_maxTempBanTime.__r < sVar2.__r) {
          sVar2 = pluginInstance.m_maxTempBanTime;
        }
        name_00._M_str = (char *)banner._M_string_length;
        name_00._M_len = (size_t)banner._M_dataplus._M_p;
        local_b0 = banner.field_2._M_allocated_capacity;
        local_a8 = (char *)banner.field_2._8_8_;
        pVar4 = findPlayerByPartName(source,channel,name_00);
        goto LAB_0012e3e1;
      }
    }
  }
  else {
LAB_0012e3e1:
    if (pVar4.server == (Server *)0x0) {
      pcVar3 = "Error: Channel not attached to any connected Renegade X servers.";
      uStackY_d0 = 0x40;
      goto LAB_0012e48e;
    }
    if (pVar4.player != (PlayerInfo *)0x0) {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&banner,&nick_local,(allocator<char> *)&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&banner,"@IRC");
      if (local_b0 == 0) {
        local_a8 = "No reason";
        local_b0 = 9;
      }
      RenX::Server::banPlayer
                (pVar4.server,pVar4.player,banner._M_string_length,banner._M_dataplus._M_p,local_b0,
                 local_a8,sVar2.__r);
      Jupiter::IRC::Client::sendMessage(source,channel._M_len,channel._M_str,0xe,"Player banned.");
      std::__cxx11::string::~string((string *)&banner);
      return;
    }
  }
  pcVar3 = "Error: Could not find player.";
  uStackY_d0 = 0x1d;
LAB_0012e48e:
  Jupiter::IRC::Client::sendMessage(source,channel._M_len,channel._M_str,uStackY_d0,pcVar3);
  return;
}

Assistant:

void TempBanIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: TempBan [Duration] <Player> [Reason]"sv);
		return;
	}

	std::chrono::seconds duration = pluginInstance.getDefaultTBanTime();
	auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	std::string_view name = command_split.first;
	std::string_view reason = command_split.second;

	// Try searching by name first
	auto search_result = findPlayerByPartName(source, channel, name);
	if (search_result.server != nullptr
		&& search_result.player == nullptr
		&& !command_split.second.empty()) {
		// Try reading token as a duration instead, and search the name token if duration > 0
		duration = jessilib::duration_from_string(name.data(), name.data() + name.size()).duration;
		if (duration.count() > 0) {
			// It reads as a duration; sanity check & try searching again
			command_split = jessilib::word_split_once_view(command_split.second, WHITESPACE_SV);
			duration = std::min(duration, pluginInstance.getMaxTBanTime());
			name = command_split.first;
			reason = command_split.second;
			search_result = findPlayerByPartName(source, channel, name);
		}
	}

	if (search_result.server == nullptr) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	if (search_result.player == nullptr) {
		source->sendMessage(channel, "Error: Could not find player."sv);
		return;
	}

	if (reason.empty()) {
		reason = "No reason"sv;
	}

	std::string banner{ nick };
	banner += "@IRC";
	search_result.server->banPlayer(*search_result.player, banner, reason, duration);
	source->sendMessage(channel, "Player banned."sv);
}